

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O3

int main(void)

{
  _Bool _Var1;
  
  _Var1 = testbinaryfuse8(10000000);
  if (_Var1) {
    _Var1 = testbufferedxor8(10000000);
    if (_Var1) {
      _Var1 = testxor8(10000000);
      if (_Var1) {
        _Var1 = testbinaryfuse16(10000000);
        if (_Var1) {
          _Var1 = testbufferedxor16(10000000);
          if (_Var1) {
            _Var1 = testxor16(10000000);
            if (_Var1) {
              putchar(10);
              return 0;
            }
          }
        }
      }
    }
  }
  abort();
}

Assistant:

int main() {
  for (size_t s = 10000000; s <= 10000000; s *= 10) {
    if (!testbinaryfuse8(s)) { abort(); }
    if (!testbufferedxor8(s)) { abort(); }
    if (!testxor8(s)) { abort(); }
    if (!testbinaryfuse16(s)) { abort(); }
    if (!testbufferedxor16(s)) { abort(); }
    if (!testxor16(s)) { abort(); }

    printf("\n");
  }
}